

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HilbertCurve.h
# Opt level: O0

size_t anurbs::HilbertCurve<3L>::index_at(size_t m,VectorU *p)

{
  CoeffReturnType puVar1;
  size_t sVar2;
  size_t sVar3;
  size_t w;
  size_t l;
  Index j;
  size_t s;
  Index i;
  size_t vd;
  size_t ve;
  size_t h;
  VectorU *p_local;
  size_t m_local;
  
  ve = 0;
  vd = 0;
  i = 0;
  for (s = m - 1; -1 < (long)s; s = s - 1) {
    j = 0;
    for (l = 0; (long)l < 3; l = l + 1) {
      puVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>,_0> *)p,l);
      sVar2 = bit(*puVar1,s);
      j = (sVar2 << ((byte)l & 0x3f)) + j;
    }
    sVar2 = t(vd,i,j);
    sVar2 = inverse_gc(sVar2);
    sVar3 = e(sVar2);
    sVar3 = rol(sVar3,i + 1);
    vd = vd ^ sVar3;
    sVar3 = d(sVar2);
    i = (i + sVar3 + 1) % 3;
    ve = ve << 3 | sVar2;
  }
  return ve;
}

Assistant:

static size_t index_at(const size_t m, const VectorU p) noexcept
    {
        // FIXME: check m

        size_t h = 0;
        size_t ve = 0;
        size_t vd = 0;

        for (Index i = m - 1; i > -1; i--) {
            size_t s = 0;

            for (Index j = 0; j < TDimension; j++) {
                s += bit(p[j], i) << j;
            }

            const size_t l = t(ve, vd, s);
            const size_t w = inverse_gc(l);

            ve = ve ^ (rol(e(w), vd + 1));
            vd = (vd + d(w) + 1) % TDimension;
            h = (h << TDimension) | w;
        }

        return h;
    }